

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring_array.c
# Opt level: O1

_Bool ra_has_run_container(roaring_array_t *ra)

{
  ulong uVar1;
  ulong uVar2;
  uint8_t uVar3;
  bool bVar4;
  bool bVar5;
  
  uVar1 = (ulong)ra->size;
  bVar4 = 0 < (long)uVar1;
  if (0 < (long)uVar1) {
    uVar2 = 1;
    do {
      uVar3 = ra->typecodes[uVar2 - 1];
      if (uVar3 == '\x04') {
        uVar3 = *(uint8_t *)((long)ra->containers[uVar2 - 1] + 8);
      }
      if (uVar3 == '\x03') {
        return bVar4;
      }
      bVar4 = uVar2 < uVar1;
      bVar5 = uVar2 != uVar1;
      uVar2 = uVar2 + 1;
    } while (bVar5);
  }
  return bVar4;
}

Assistant:

bool ra_has_run_container(const roaring_array_t *ra) {
    for (int32_t k = 0; k < ra->size; ++k) {
        if (get_container_type(ra->containers[k], ra->typecodes[k]) ==
            RUN_CONTAINER_TYPE)
            return true;
    }
    return false;
}